

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_exr(string *filename,uint32_t width,uint32_t height,uint16_t spp,
              vector<float,_std::allocator<float>_> *buffer)

{
  Channel *pCVar1;
  int iVar2;
  char *pcVar3;
  Box *pBVar4;
  ulong uVar5;
  runtime_error *this;
  undefined1 local_178 [8];
  OutputFile exr_out;
  Channel local_168 [16];
  undefined1 local_158 [8];
  Slice slice_1;
  ushort local_11a;
  uint16_t c;
  char *layer_names [4];
  undefined1 local_e8 [8];
  Slice slice;
  undefined1 local_b0 [8];
  FrameBuffer exr_framebuffer;
  ChannelList *exr_channels;
  Header local_60 [8];
  Header exr_header;
  vector<float,_std::allocator<float>_> *buffer_local;
  uint16_t spp_local;
  uint32_t height_local;
  uint32_t width_local;
  string *filename_local;
  
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&exr_channels,0.0,0.0);
  Imf_2_5::Header::Header
            ((Header *)0x3f800000,local_60,width,height,(Vec2<float> *)&exr_channels,0,3);
  pcVar3 = (char *)Imf_2_5::Header::channels();
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)local_b0);
  if (spp == 1) {
    pBVar4 = (Box *)std::vector<float,_std::allocator<float>_>::operator[](buffer,0);
    uVar5 = Imf_2_5::Header::dataWindow();
    Imf_2_5::Slice::Make((PixelType)local_e8,(void *)0x2,pBVar4,uVar5,4,width << 2,1,0.0,true,false)
    ;
    Imf_2_5::Channel::Channel((Channel *)(layer_names + 3),FLOAT,1,1,false);
    Imf_2_5::ChannelList::insert(pcVar3,(Channel *)"Y");
    Imf_2_5::FrameBuffer::insert(local_b0,(Slice *)"Y");
  }
  else {
    if ((spp != 3) && (spp != 4)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unsupported number of samples per pixel");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    layer_names[0] = "G";
    layer_names[1] = "B";
    layer_names[2] = "A";
    for (local_11a = 0; local_11a < spp; local_11a = local_11a + 1) {
      pBVar4 = (Box *)std::vector<float,_std::allocator<float>_>::operator[]
                                (buffer,(ulong)local_11a);
      uVar5 = Imf_2_5::Header::dataWindow();
      Imf_2_5::Slice::Make
                ((PixelType)local_158,(void *)0x2,pBVar4,uVar5,(ulong)spp << 2,
                 (int)((ulong)spp << 2) * width,1,0.0,true,false);
      pCVar1 = (Channel *)layer_names[(ulong)local_11a - 1];
      Imf_2_5::Channel::Channel(local_168,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pcVar3,pCVar1);
      Imf_2_5::FrameBuffer::insert(local_b0,(Slice *)layer_names[(ulong)local_11a - 1]);
    }
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile((OutputFile *)local_178,pcVar3,local_60,iVar2);
  Imf_2_5::OutputFile::setFrameBuffer((FrameBuffer *)local_178);
  Imf_2_5::OutputFile::writePixels((int)local_178);
  Imf_2_5::OutputFile::~OutputFile((OutputFile *)local_178);
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)local_b0);
  Imf_2_5::Header::~Header(local_60);
  return;
}

Assistant:

void write_exr(
    const std::string& filename,
    uint32_t width, uint32_t height,
    uint16_t spp,
    const std::vector<float>& buffer)
{
    Imf::Header exr_header(width, height);
    Imf::ChannelList &exr_channels = exr_header.channels();
    Imf::FrameBuffer exr_framebuffer;

    if (spp == 1) {
        Imf::Slice slice = Imf::Slice::Make(
            Imf::FLOAT,
            &buffer[0],
            exr_header.dataWindow(),
            sizeof(float), sizeof(float) * width
        );

        exr_channels.insert("Y", Imf::Channel(Imf::FLOAT));
        exr_framebuffer.insert("Y", slice);
    } else if (spp == 3 || spp == 4) {
        const char* layer_names[4] = {"R", "G", "B", "A"};

        for (uint16_t c = 0; c < spp; c++) {
            Imf::Slice slice = Imf::Slice::Make(
                Imf::FLOAT,
                &buffer[c],
                exr_header.dataWindow(),
                spp * sizeof(float), spp * sizeof(float) * width
            );

            exr_channels.insert(layer_names[c], Imf::Channel(Imf::FLOAT));
            exr_framebuffer.insert(layer_names[c], slice);
        }
    } else {
        throw std::runtime_error("unsupported number of samples per pixel");
    }

    Imf::OutputFile exr_out(filename.c_str(), exr_header);
    exr_out.setFrameBuffer(exr_framebuffer);
    exr_out.writePixels(height);
}